

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t_conflict *ctx,aom_codec_enc_cfg_t *cfg)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  undefined8 *in_RDI;
  int i;
  _Bool is_sb_size_changed;
  int force_key;
  aom_codec_err_t res;
  aom_codec_enc_cfg_t *in_stack_00000020;
  aom_codec_alg_priv_t_conflict *in_stack_00000028;
  AV1_PRIMARY *in_stack_00000030;
  _Bool in_stack_00000077;
  AV1EncoderConfig *in_stack_00000078;
  AV1_COMP *in_stack_00000080;
  av1_extracfg *in_stack_000000c0;
  aom_codec_enc_cfg_t *in_stack_000000c8;
  AV1EncoderConfig *in_stack_000000d0;
  int local_28;
  aom_codec_err_t local_4;
  
  bVar1 = false;
  if ((*(int *)((long)in_RSI + 0xc) != *(int *)((long)in_RDI + 0xdc)) ||
     (*(int *)((long)in_RSI + 0x10) != *(int *)(in_RDI + 0x1c))) {
    if ((1 < *(uint *)((long)in_RSI + 0x38)) || (*(int *)((long)in_RSI + 0x34) != 0)) {
      *in_RDI = "Cannot change width or height after initialization";
      return AOM_CODEC_INVALID_PARAM;
    }
    if ((((*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x9d338) == 1) &&
         (*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71304) != 0)) &&
        (*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71308) != 0)) &&
       (((iVar2 = valid_ref_frame_size
                            (*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71304),
                             *(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71308),
                             *(int *)((long)in_RSI + 0xc),*(int *)((long)in_RSI + 0x10)), iVar2 == 0
         || (*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71304) < *(int *)((long)in_RSI + 0xc)))
        || (*(int *)(*(long *)(in_RDI[0x16a] + 0x160) + 0x71308) < *(int *)((long)in_RSI + 0x10)))))
    {
      bVar1 = true;
    }
  }
  if (((*(byte *)(in_RDI + 0x16a4) & 1) == 0) || (*(int *)((long)in_RSI + 0xd0) != 0)) {
    if (*(uint *)(in_RDI + 0x21) < *(uint *)((long)in_RSI + 0x38)) {
      *in_RDI = "Cannot increase lag_in_frames";
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
    else if ((*(int *)((long)in_RSI + 0x38) == *(int *)(in_RDI + 0x21)) ||
            (*(int *)(in_RDI + 0x169e) < 1)) {
      local_4 = validate_config(in_stack_00000028,in_stack_00000020,(av1_extracfg *)ctx);
      if (local_4 == AOM_CODEC_OK) {
        memcpy(in_RDI + 0x1a,in_RSI,0x388);
        set_encoder_config(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0);
        bVar1 = (bool)(*(char *)(in_RDI[0x16a] + 0xbffd) != *(char *)((long)in_RDI + 0xb04) | bVar1)
        ;
        av1_change_config_seq
                  (in_stack_00000030,(AV1EncoderConfig *)in_stack_00000028,
                   (_Bool *)in_stack_00000020);
        for (local_28 = 0; local_28 < *(int *)(in_RDI[0x16a] + 0x148); local_28 = local_28 + 1) {
          av1_change_config(in_stack_00000080,in_stack_00000078,in_stack_00000077);
        }
        if (*(long *)(in_RDI[0x16a] + 0x168) != 0) {
          av1_change_config(in_stack_00000080,in_stack_00000078,in_stack_00000077);
        }
      }
      if (bVar1) {
        in_RDI[0x183] = in_RDI[0x183] | 1;
      }
    }
    else {
      *in_RDI = "Cannot change lag_in_frames if LAP is enabled";
      local_4 = AOM_CODEC_INVALID_PARAM;
    }
  }
  else {
    *in_RDI = "Cannot change to monochrome = 0 after init with monochrome";
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t encoder_set_config(aom_codec_alg_priv_t *ctx,
                                          const aom_codec_enc_cfg_t *cfg) {
  aom_codec_err_t res;
  int force_key = 0;

  if (cfg->g_w != ctx->cfg.g_w || cfg->g_h != ctx->cfg.g_h) {
    if (cfg->g_lag_in_frames > 1 || cfg->g_pass != AOM_RC_ONE_PASS)
      ERROR("Cannot change width or height after initialization");
    // Note: function encoder_set_config() is allowed to be called multiple
    // times. However, when the original frame width or height is less than two
    // times of the new frame width or height, a forced key frame should be
    // used (for the case of single spatial layer, since otherwise a previous
    // encoded frame at a lower layer may be the desired reference). To make
    // sure the correct detection of a forced key frame, we need
    // to update the frame width and height only when the actual encoding is
    // performed. cpi->last_coded_width and cpi->last_coded_height are used to
    // track the actual coded frame size.
    if (ctx->ppi->cpi->svc.number_spatial_layers == 1 &&
        ctx->ppi->cpi->last_coded_width && ctx->ppi->cpi->last_coded_height &&
        (!valid_ref_frame_size(ctx->ppi->cpi->last_coded_width,
                               ctx->ppi->cpi->last_coded_height, cfg->g_w,
                               cfg->g_h) ||
         ((int)cfg->g_w > ctx->ppi->cpi->last_coded_width) ||
         ((int)cfg->g_h > ctx->ppi->cpi->last_coded_height))) {
      force_key = 1;
    }
  }

  if (ctx->monochrome_on_init && cfg->monochrome == 0) {
    // TODO(aomedia:3465): Allow this case to work without requiring re-init
    // of encoder.
    ERROR("Cannot change to monochrome = 0 after init with monochrome");
  }

  // Prevent increasing lag_in_frames. This check is stricter than it needs
  // to be -- the limit is not increasing past the first lag_in_frames
  // value, but we don't track the initial config, only the last successful
  // config.
  if (cfg->g_lag_in_frames > ctx->cfg.g_lag_in_frames)
    ERROR("Cannot increase lag_in_frames");
  // Prevent changing lag_in_frames if Lookahead Processing is enabled
  if (cfg->g_lag_in_frames != ctx->cfg.g_lag_in_frames &&
      ctx->num_lap_buffers > 0)
    ERROR("Cannot change lag_in_frames if LAP is enabled");

  res = validate_config(ctx, cfg, &ctx->extra_cfg);

  if (res == AOM_CODEC_OK) {
    ctx->cfg = *cfg;
    set_encoder_config(&ctx->oxcf, &ctx->cfg, &ctx->extra_cfg);
    // On profile change, request a key frame
    force_key |= ctx->ppi->seq_params.profile != ctx->oxcf.profile;
    bool is_sb_size_changed = false;
    av1_change_config_seq(ctx->ppi, &ctx->oxcf, &is_sb_size_changed);
    for (int i = 0; i < ctx->ppi->num_fp_contexts; i++) {
      av1_change_config(ctx->ppi->parallel_cpi[i], &ctx->oxcf,
                        is_sb_size_changed);
    }
    if (ctx->ppi->cpi_lap != NULL) {
      av1_change_config(ctx->ppi->cpi_lap, &ctx->oxcf, is_sb_size_changed);
    }
  }

  if (force_key) ctx->next_frame_flags |= AOM_EFLAG_FORCE_KF;

  return res;
}